

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsTransformedLp.cpp
# Opt level: O2

bool __thiscall
HighsTransformedLp::transform
          (HighsTransformedLp *this,vector<double,_std::allocator<double>_> *vals,
          vector<double,_std::allocator<double>_> *upper,
          vector<double,_std::allocator<double>_> *solval,vector<int,_std::allocator<int>_> *inds,
          double *rhs,bool *integersPositive,bool preferVbds)

{
  vector<int,_std::allocator<int>_> *this_00;
  double *pdVar1;
  double dVar2;
  BoundType BVar3;
  HighsInt HVar4;
  int iVar5;
  pointer ppVar6;
  HighsMipSolverData *pHVar7;
  pointer pHVar8;
  pointer piVar9;
  vector<double,_std::allocator<double>_> *pvVar10;
  vector<int,_std::allocator<int>_> *pvVar11;
  bool bVar12;
  ulong uVar13;
  pointer pBVar14;
  pointer pdVar15;
  vector<double,_std::allocator<double>_> *pvVar16;
  int iVar17;
  size_type __new_size;
  HighsInt i;
  HighsMipSolver *pHVar18;
  ulong uVar19;
  double dVar20;
  double dVar21;
  bool infeasible;
  bool redundant;
  HighsInt numNz;
  HighsCDouble tmpRhs;
  anon_class_24_3_5cef1ea4 getLb;
  anon_class_24_3_19d45739 remove;
  HighsInt slackOffset;
  anon_class_24_3_5cef1ea4 getUb;
  bool local_102;
  bool local_101;
  vector<double,_std::allocator<double>_> *local_100;
  uint local_f4;
  HighsMipSolver *local_f0;
  double local_e8;
  HighsSparseVectorSum *local_e0;
  vector<int,_std::allocator<int>_> *local_d8;
  vector<double,_std::allocator<double>_> *local_d0;
  double local_c8;
  vector<double,_std::allocator<double>_> *local_c0;
  HighsCDouble local_b8;
  vector<double,_std::allocator<double>_> *local_a8;
  vector<double,_std::allocator<double>_> *local_a0;
  anon_class_24_3_5cef1ea4 local_98;
  double *local_80;
  HighsTransformedLp *local_78;
  double local_70;
  anon_class_24_3_19d45739 local_68;
  HighsInt local_4c;
  anon_class_24_3_5cef1ea4 local_48;
  
  local_b8.hi = *rhs;
  local_b8.lo = 0.0;
  pHVar18 = this->lprelaxation->mipsolver;
  local_4c = (this->lprelaxation->lpsolver).model_.lp_.num_col_;
  local_98.slackOffset = &local_4c;
  uVar13 = (ulong)((long)(inds->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                         super__Vector_impl_data._M_finish -
                  (long)(inds->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                        super__Vector_impl_data._M_start) >> 2;
  local_68.numNz = (HighsInt *)&local_f4;
  local_f4 = (uint)uVar13;
  local_c0 = &this->lbDist;
  local_d0 = &this->ubDist;
  local_e0 = &this->vectorsum;
  iVar17 = 0;
  local_100 = vals;
  local_f0 = pHVar18;
  local_d8 = inds;
  local_a8 = solval;
  local_a0 = upper;
  local_98.mip = pHVar18;
  local_98.this = this;
  local_80 = rhs;
  local_68.inds = inds;
  local_68.vals = vals;
  local_48.slackOffset = local_98.slackOffset;
  local_48.mip = pHVar18;
  local_48.this = this;
  while( true ) {
    if ((int)uVar13 <= iVar17) break;
    HVar4 = (local_d8->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
            super__Vector_impl_data._M_start[iVar17];
    local_e8 = transform::anon_class_24_3_5cef1ea4::operator()(&local_98,HVar4);
    dVar20 = transform::anon_class_24_3_5cef1ea4::operator()(&local_48,HVar4);
    dVar21 = dVar20 - local_e8;
    if ((pHVar18->options_mip_->super_HighsOptionsStruct).small_matrix_value <= dVar21) {
      if ((local_e8 <= -INFINITY) && (INFINITY <= dVar20)) goto LAB_002eddbb;
      ppVar6 = (this->bestVub).
               super__Vector_base<std::pair<int,_HighsImplications::VarBound>,_std::allocator<std::pair<int,_HighsImplications::VarBound>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      local_c8 = dVar20;
      local_70 = dVar21;
      if (ppVar6[HVar4].first != -1) {
        dVar20 = HighsImplications::VarBound::maxValue(&ppVar6[HVar4].second);
        pHVar7 = (local_f0->mipdata_)._M_t.
                 super___uniq_ptr_impl<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_HighsMipSolverData_*,_std::default_delete<HighsMipSolverData>_>
                 .super__Head_base<0UL,_HighsMipSolverData_*,_false>._M_head_impl;
        if (pHVar7->feastol + local_c8 < dVar20) {
          local_101 = false;
          local_102 = false;
          ppVar6 = (this->bestVub).
                   super__Vector_base<std::pair<int,_HighsImplications::VarBound>,_std::allocator<std::pair<int,_HighsImplications::VarBound>_>_>
                   ._M_impl.super__Vector_impl_data._M_start + HVar4;
          HighsImplications::cleanupVub
                    (&pHVar7->implications,HVar4,ppVar6->first,&ppVar6->second,local_c8,&local_101,
                     &local_102,false);
        }
      }
      ppVar6 = (this->bestVlb).
               super__Vector_base<std::pair<int,_HighsImplications::VarBound>,_std::allocator<std::pair<int,_HighsImplications::VarBound>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      if (ppVar6[HVar4].first != -1) {
        dVar20 = HighsImplications::VarBound::minValue(&ppVar6[HVar4].second);
        pHVar7 = (local_f0->mipdata_)._M_t.
                 super___uniq_ptr_impl<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_HighsMipSolverData_*,_std::default_delete<HighsMipSolverData>_>
                 .super__Head_base<0UL,_HighsMipSolverData_*,_false>._M_head_impl;
        if (dVar20 < local_e8 - pHVar7->feastol) {
          local_101 = false;
          local_102 = false;
          ppVar6 = (this->bestVlb).
                   super__Vector_base<std::pair<int,_HighsImplications::VarBound>,_std::allocator<std::pair<int,_HighsImplications::VarBound>_>_>
                   ._M_impl.super__Vector_impl_data._M_start + HVar4;
          HighsImplications::cleanupVlb
                    (&pHVar7->implications,HVar4,ppVar6->first,&ppVar6->second,local_e8,&local_101,
                     &local_102,false);
        }
      }
      BVar3 = (this->boundTypes).
              super__Vector_base<HighsTransformedLp::BoundType,_std::allocator<HighsTransformedLp::BoundType>_>
              ._M_impl.super__Vector_impl_data._M_start[HVar4];
      bVar12 = HighsLpRelaxation::isColIntegral(this->lprelaxation,HVar4);
      pvVar10 = local_100;
      if (bVar12) {
        if (local_70 <= 1.5) {
          pdVar15 = (this->simpleLbDist).super__Vector_base<double,_std::allocator<double>_>._M_impl
                    .super__Vector_impl_data._M_start;
        }
        else {
          pdVar15 = (this->simpleLbDist).super__Vector_base<double,_std::allocator<double>_>._M_impl
                    .super__Vector_impl_data._M_start;
          dVar20 = (this->boundDist).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start[HVar4];
          if ((((dVar20 == 0.0) && (!NAN(dVar20))) &&
              ((pdVar15[HVar4] != 0.0 || (NAN(pdVar15[HVar4]))))) &&
             ((dVar20 = (this->simpleUbDist).super__Vector_base<double,_std::allocator<double>_>.
                        _M_impl.super__Vector_impl_data._M_start[HVar4], dVar20 != 0.0 ||
              (NAN(dVar20))))) {
            if ((this->bestVlb).
                super__Vector_base<std::pair<int,_HighsImplications::VarBound>,_std::allocator<std::pair<int,_HighsImplications::VarBound>_>_>
                ._M_impl.super__Vector_impl_data._M_start[HVar4].first == -1) {
LAB_002edb13:
              pBVar14 = (this->boundTypes).
                        super__Vector_base<HighsTransformedLp::BoundType,_std::allocator<HighsTransformedLp::BoundType>_>
                        ._M_impl.super__Vector_impl_data._M_start + HVar4;
            }
            else {
              dVar20 = (local_d0->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                       super__Vector_impl_data._M_start[HVar4];
              dVar21 = (local_c0->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                       super__Vector_impl_data._M_start[HVar4];
              dVar2 = ((local_f0->mipdata_)._M_t.
                       super___uniq_ptr_impl<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_HighsMipSolverData_*,_std::default_delete<HighsMipSolverData>_>
                       .super__Head_base<0UL,_HighsMipSolverData_*,_false>._M_head_impl)->feastol;
              if (dVar20 < dVar21 - dVar2) goto LAB_002edb13;
              if ((dVar21 < dVar20 - dVar2) ||
                 ((this->bestVub).
                  super__Vector_base<std::pair<int,_HighsImplications::VarBound>,_std::allocator<std::pair<int,_HighsImplications::VarBound>_>_>
                  ._M_impl.super__Vector_impl_data._M_start[HVar4].first == -1)) goto LAB_002eda6b;
              pBVar14 = (this->boundTypes).
                        super__Vector_base<HighsTransformedLp::BoundType,_std::allocator<HighsTransformedLp::BoundType>_>
                        ._M_impl.super__Vector_impl_data._M_start + HVar4;
              if ((local_100->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                  super__Vector_impl_data._M_start[iVar17] <= 0.0) goto LAB_002eda75;
            }
            *pBVar14 = kVariableUb;
            HighsCDouble::operator-=
                      (&local_b8,
                       (this->bestVub).
                       super__Vector_base<std::pair<int,_HighsImplications::VarBound>,_std::allocator<std::pair<int,_HighsImplications::VarBound>_>_>
                       ._M_impl.super__Vector_impl_data._M_start[HVar4].second.constant *
                       (local_100->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                       super__Vector_impl_data._M_start[iVar17]);
            ppVar6 = (this->bestVub).
                     super__Vector_base<std::pair<int,_HighsImplications::VarBound>,_std::allocator<std::pair<int,_HighsImplications::VarBound>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            HighsSparseVectorSum::add
                      (local_e0,ppVar6[HVar4].first,
                       (pvVar10->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                       super__Vector_impl_data._M_start[iVar17] * ppVar6[HVar4].second.coef);
            pdVar15 = (pvVar10->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                      super__Vector_impl_data._M_start;
            dVar20 = pdVar15[iVar17];
            dVar21 = -dVar20;
            pdVar15[iVar17] = dVar21;
            if (dVar20 < dVar21) goto LAB_002edc1d;
            goto LAB_002edc3d;
          }
        }
        dVar20 = (this->simpleUbDist).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start[HVar4];
        dVar21 = ((local_f0->mipdata_)._M_t.
                  super___uniq_ptr_impl<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_HighsMipSolverData_*,_std::default_delete<HighsMipSolverData>_>
                  .super__Head_base<0UL,_HighsMipSolverData_*,_false>._M_head_impl)->feastol;
        if (dVar20 - dVar21 <= pdVar15[HVar4]) {
          if (pdVar15[HVar4] - dVar21 <= dVar20) {
            pBVar14 = (this->boundTypes).
                      super__Vector_base<HighsTransformedLp::BoundType,_std::allocator<HighsTransformedLp::BoundType>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            if (0.0 < (local_100->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                      super__Vector_impl_data._M_start[iVar17]) goto LAB_002ed9c8;
          }
          else {
            pBVar14 = (this->boundTypes).
                      super__Vector_base<HighsTransformedLp::BoundType,_std::allocator<HighsTransformedLp::BoundType>_>
                      ._M_impl.super__Vector_impl_data._M_start;
          }
          pBVar14[HVar4] = kSimpleUb;
        }
        else {
          pBVar14 = (this->boundTypes).
                    super__Vector_base<HighsTransformedLp::BoundType,_std::allocator<HighsTransformedLp::BoundType>_>
                    ._M_impl.super__Vector_impl_data._M_start;
LAB_002ed9c8:
          pBVar14[HVar4] = kSimpleLb;
        }
        iVar17 = iVar17 + 1;
        pHVar18 = local_f0;
      }
      else {
        dVar20 = (local_c0->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                 super__Vector_impl_data._M_start[HVar4];
        dVar21 = (local_d0->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                 super__Vector_impl_data._M_start[HVar4];
        dVar2 = ((local_f0->mipdata_)._M_t.
                 super___uniq_ptr_impl<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_HighsMipSolverData_*,_std::default_delete<HighsMipSolverData>_>
                 .super__Head_base<0UL,_HighsMipSolverData_*,_false>._M_head_impl)->feastol;
        if (dVar21 - dVar2 <= dVar20) {
          if (dVar21 < dVar20 - dVar2) {
            if (((this->bestVub).
                 super__Vector_base<std::pair<int,_HighsImplications::VarBound>,_std::allocator<std::pair<int,_HighsImplications::VarBound>_>_>
                 ._M_impl.super__Vector_impl_data._M_start[HVar4].first == -1) ||
               (((!preferVbds &&
                 (pdVar1 = (local_100->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                           super__Vector_impl_data._M_start + iVar17,
                 0.0 < *pdVar1 || *pdVar1 == 0.0)) &&
                ((this->simpleUbDist).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start[HVar4] <= dVar21 + dVar2)))) {
LAB_002edbe9:
              (this->boundTypes).
              super__Vector_base<HighsTransformedLp::BoundType,_std::allocator<HighsTransformedLp::BoundType>_>
              ._M_impl.super__Vector_impl_data._M_start[HVar4] = kSimpleUb;
              dVar20 = (local_100->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                       super__Vector_impl_data._M_start[iVar17];
              dVar21 = local_c8;
              if (dVar20 < 0.0) goto LAB_002edc0f;
              goto LAB_002edc3d;
            }
            goto LAB_002edb13;
          }
          if ((local_100->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
              super__Vector_impl_data._M_start[iVar17] <= 0.0) {
            if ((this->bestVub).
                super__Vector_base<std::pair<int,_HighsImplications::VarBound>,_std::allocator<std::pair<int,_HighsImplications::VarBound>_>_>
                ._M_impl.super__Vector_impl_data._M_start[HVar4].first != -1) goto LAB_002edb13;
            if ((!preferVbds) ||
               ((this->bestVlb).
                super__Vector_base<std::pair<int,_HighsImplications::VarBound>,_std::allocator<std::pair<int,_HighsImplications::VarBound>_>_>
                ._M_impl.super__Vector_impl_data._M_start[HVar4].first == -1)) goto LAB_002edbe9;
          }
          else if ((this->bestVlb).
                   super__Vector_base<std::pair<int,_HighsImplications::VarBound>,_std::allocator<std::pair<int,_HighsImplications::VarBound>_>_>
                   ._M_impl.super__Vector_impl_data._M_start[HVar4].first == -1) {
            if ((!preferVbds) ||
               ((this->bestVub).
                super__Vector_base<std::pair<int,_HighsImplications::VarBound>,_std::allocator<std::pair<int,_HighsImplications::VarBound>_>_>
                ._M_impl.super__Vector_impl_data._M_start[HVar4].first == -1)) goto LAB_002edba8;
            goto LAB_002edb13;
          }
LAB_002eda6b:
          pBVar14 = (this->boundTypes).
                    super__Vector_base<HighsTransformedLp::BoundType,_std::allocator<HighsTransformedLp::BoundType>_>
                    ._M_impl.super__Vector_impl_data._M_start + HVar4;
LAB_002eda75:
          *pBVar14 = kVariableLb;
          HighsCDouble::operator-=
                    (&local_b8,
                     (this->bestVlb).
                     super__Vector_base<std::pair<int,_HighsImplications::VarBound>,_std::allocator<std::pair<int,_HighsImplications::VarBound>_>_>
                     ._M_impl.super__Vector_impl_data._M_start[HVar4].second.constant *
                     (local_100->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                     super__Vector_impl_data._M_start[iVar17]);
          ppVar6 = (this->bestVlb).
                   super__Vector_base<std::pair<int,_HighsImplications::VarBound>,_std::allocator<std::pair<int,_HighsImplications::VarBound>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          HighsSparseVectorSum::add
                    (local_e0,ppVar6[HVar4].first,
                     (pvVar10->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                     super__Vector_impl_data._M_start[iVar17] * ppVar6[HVar4].second.coef);
          if ((pvVar10->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
              super__Vector_impl_data._M_start[iVar17] <= 0.0) goto LAB_002edc3d;
LAB_002edc1d:
          (this->boundTypes).
          super__Vector_base<HighsTransformedLp::BoundType,_std::allocator<HighsTransformedLp::BoundType>_>
          ._M_impl.super__Vector_impl_data._M_start[HVar4] = BVar3;
          transform::anon_class_24_3_19d45739::operator()(&local_68,iVar17);
          pHVar18 = local_f0;
        }
        else {
          if (((this->bestVlb).
               super__Vector_base<std::pair<int,_HighsImplications::VarBound>,_std::allocator<std::pair<int,_HighsImplications::VarBound>_>_>
               ._M_impl.super__Vector_impl_data._M_start[HVar4].first != -1) &&
             (((preferVbds ||
               (0.0 < (local_100->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                      super__Vector_impl_data._M_start[iVar17])) ||
              (dVar20 + dVar2 <
               (this->simpleLbDist).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start[HVar4])))) goto LAB_002eda6b;
LAB_002edba8:
          (this->boundTypes).
          super__Vector_base<HighsTransformedLp::BoundType,_std::allocator<HighsTransformedLp::BoundType>_>
          ._M_impl.super__Vector_impl_data._M_start[HVar4] = kSimpleLb;
          dVar20 = (local_100->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                   super__Vector_impl_data._M_start[iVar17];
          dVar21 = local_e8;
          if (0.0 < dVar20) {
LAB_002edc0f:
            HighsCDouble::operator-=(&local_b8,dVar21 * dVar20);
            goto LAB_002edc1d;
          }
LAB_002edc3d:
          iVar17 = iVar17 + 1;
          pHVar18 = local_f0;
        }
      }
    }
    else {
      if (local_e8 <= dVar20) {
        dVar20 = local_e8;
      }
      HighsCDouble::operator-=
                (&local_b8,
                 dVar20 * (local_100->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                          super__Vector_impl_data._M_start[iVar17]);
      transform::anon_class_24_3_19d45739::operator()(&local_68,iVar17);
    }
    uVar13 = (ulong)local_f4;
  }
  if ((this->vectorsum).nonzeroinds.super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_start ==
      (this->vectorsum).nonzeroinds.super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    std::vector<double,_std::allocator<double>_>::resize(local_100,(long)(int)uVar13);
    std::vector<int,_std::allocator<int>_>::resize(local_d8,(long)(int)local_f4);
  }
  else {
    this_00 = &(this->vectorsum).nonzeroinds;
    for (uVar19 = 0; pHVar18 = local_f0, uVar19 != (uVar13 & 0xffffffff); uVar19 = uVar19 + 1) {
      dVar20 = (local_100->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
               super__Vector_impl_data._M_start[uVar19];
      if ((dVar20 != 0.0) || (NAN(dVar20))) {
        HighsSparseVectorSum::add
                  (local_e0,(local_d8->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                            super__Vector_impl_data._M_start[uVar19],dVar20);
        uVar13 = (ulong)local_f4;
      }
    }
    pHVar8 = (this->vectorsum).values.
             super__Vector_base<HighsCDouble,_std::allocator<HighsCDouble>_>._M_impl.
             super__Vector_impl_data._M_start;
    piVar9 = (this->vectorsum).nonzeroinds.super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    uVar13 = (ulong)((long)(this->vectorsum).nonzeroinds.
                           super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_finish - (long)piVar9) >> 2;
    uVar19 = uVar13 & 0xffffffff;
    while( true ) {
      __new_size = (size_type)(int)uVar13;
      if ((int)uVar19 < 1) break;
      iVar17 = piVar9[uVar19 - 1];
      uVar19 = uVar19 - 1;
      if (ABS(pHVar8[iVar17].hi + pHVar8[iVar17].lo) <=
          (local_f0->options_mip_->super_HighsOptionsStruct).small_matrix_value) {
        uVar13 = (ulong)((int)uVar13 - 1);
        pHVar8[iVar17].hi = 0.0;
        pHVar8[iVar17].lo = 0.0;
        iVar5 = piVar9[__new_size - 1];
        piVar9[__new_size - 1] = iVar17;
        piVar9[uVar19] = iVar5;
      }
    }
    std::vector<int,_std::allocator<int>_>::resize(this_00,__new_size);
    pvVar11 = local_d8;
    pdVar1 = &((pHVar18->mipdata_)._M_t.
               super___uniq_ptr_impl<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>.
               _M_t.
               super__Tuple_impl<0UL,_HighsMipSolverData_*,_std::default_delete<HighsMipSolverData>_>
               .super__Head_base<0UL,_HighsMipSolverData_*,_false>._M_head_impl)->feastol;
    if (*pdVar1 <= 0.0 && *pdVar1 != 0.0) {
LAB_002eddbb:
      HighsSparseVectorSum::clear(local_e0);
      return false;
    }
    std::vector<int,_std::allocator<int>_>::operator=(local_d8,this_00);
    pvVar10 = local_100;
    local_f4 = (uint)((ulong)((long)(pvVar11->super__Vector_base<int,_std::allocator<int>_>)._M_impl
                                    .super__Vector_impl_data._M_finish -
                             (long)(pvVar11->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                                   super__Vector_impl_data._M_start) >> 2);
    std::vector<double,_std::allocator<double>_>::resize(local_100,(long)(int)local_f4);
    piVar9 = (pvVar11->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
             super__Vector_impl_data._M_start;
    pHVar8 = (local_e0->values).super__Vector_base<HighsCDouble,_std::allocator<HighsCDouble>_>.
             _M_impl.super__Vector_impl_data._M_start;
    pdVar15 = (pvVar10->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
              super__Vector_impl_data._M_start;
    for (uVar13 = 0; local_f4 != uVar13; uVar13 = uVar13 + 1) {
      iVar17 = piVar9[uVar13];
      pdVar15[uVar13] = pHVar8[iVar17].hi + pHVar8[iVar17].lo;
    }
    HighsSparseVectorSum::clear(local_e0);
  }
  for (uVar13 = 0; uVar13 != local_f4; uVar13 = uVar13 + 1) {
    HVar4 = (local_d8->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
            super__Vector_impl_data._M_start[uVar13];
    local_c8 = transform::anon_class_24_3_5cef1ea4::operator()(&local_98,HVar4);
    local_e8 = transform::anon_class_24_3_5cef1ea4::operator()(&local_48,HVar4);
    bVar12 = HighsLpRelaxation::isColIntegral(this->lprelaxation,HVar4);
    if (bVar12) {
      pBVar14 = (this->boundTypes).
                super__Vector_base<HighsTransformedLp::BoundType,_std::allocator<HighsTransformedLp::BoundType>_>
                ._M_impl.super__Vector_impl_data._M_start;
      if ((pBVar14[HVar4] & ~kSimpleLb) != kVariableUb) {
        if (*integersPositive == true) {
          if (local_c8 <= -INFINITY) {
            bVar12 = true;
            if (local_e8 < INFINITY) goto LAB_002edee5;
          }
          else {
            bVar12 = true;
            if ((local_e8 < INFINITY) &&
               ((local_100->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                super__Vector_impl_data._M_start[uVar13] <= 0.0)) {
LAB_002edee5:
              bVar12 = false;
            }
          }
        }
        else {
          dVar20 = (local_d0->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                   super__Vector_impl_data._M_start[HVar4];
          pdVar1 = (local_c0->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                   super__Vector_impl_data._M_start + HVar4;
          bVar12 = *pdVar1 <= dVar20 && dVar20 != *pdVar1;
        }
        pBVar14[HVar4] = bVar12;
      }
    }
  }
  std::vector<double,_std::allocator<double>_>::resize(local_a0,(long)(int)local_f4);
  std::vector<double,_std::allocator<double>_>::resize(local_a8,(long)(int)local_f4);
  uVar13 = 0;
  local_78 = this;
  do {
    if (uVar13 == local_f4) {
      *local_80 = local_b8.hi + local_b8.lo;
      if ((local_f4 == 0) &&
         (-((local_f0->mipdata_)._M_t.
            super___uniq_ptr_impl<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>._M_t
            .super__Tuple_impl<0UL,_HighsMipSolverData_*,_std::default_delete<HighsMipSolverData>_>.
            super__Head_base<0UL,_HighsMipSolverData_*,_false>._M_head_impl)->feastol <=
          local_b8.hi + local_b8.lo)) {
        return false;
      }
      return true;
    }
    HVar4 = (local_d8->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
            super__Vector_impl_data._M_start[uVar13];
    local_e8 = transform::anon_class_24_3_5cef1ea4::operator()(&local_98,HVar4);
    dVar20 = transform::anon_class_24_3_5cef1ea4::operator()(&local_48,HVar4);
    pvVar10 = local_100;
    (local_a0->super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data.
    _M_start[uVar13] = dVar20 - local_e8;
    pvVar16 = local_c0;
    switch((this->boundTypes).
           super__Vector_base<HighsTransformedLp::BoundType,_std::allocator<HighsTransformedLp::BoundType>_>
           ._M_impl.super__Vector_impl_data._M_start[HVar4]) {
    case kSimpleUb:
      HighsCDouble::operator-=
                (&local_b8,
                 dVar20 * (local_100->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                          super__Vector_impl_data._M_start[uVar13]);
      pdVar15 = (pvVar10->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                super__Vector_impl_data._M_start;
      pdVar15[uVar13] = -pdVar15[uVar13];
      this = local_78;
    case kVariableUb:
      pvVar16 = local_d0;
      break;
    case kSimpleLb:
      HighsCDouble::operator-=
                (&local_b8,
                 local_e8 *
                 (local_100->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                 super__Vector_impl_data._M_start[uVar13]);
      pvVar16 = local_c0;
      break;
    case kVariableLb:
      break;
    default:
      goto switchD_002edfa5_default;
    }
    (local_a8->super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data.
    _M_start[uVar13] =
         (pvVar16->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
         super__Vector_impl_data._M_start[HVar4];
switchD_002edfa5_default:
    bVar12 = HighsLpRelaxation::isColIntegral(this->lprelaxation,HVar4);
    if (bVar12) {
      if (*integersPositive == true) {
        bVar12 = 0.0 < (local_100->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                       super__Vector_impl_data._M_start[uVar13];
      }
      else {
        bVar12 = false;
      }
      *integersPositive = bVar12;
    }
    uVar13 = uVar13 + 1;
  } while( true );
}

Assistant:

bool HighsTransformedLp::transform(std::vector<double>& vals,
                                   std::vector<double>& upper,
                                   std::vector<double>& solval,
                                   std::vector<HighsInt>& inds, double& rhs,
                                   bool& integersPositive, bool preferVbds) {
  // vector sum should be empty
  assert(vectorsum.getNonzeros().empty());

  HighsCDouble tmpRhs = rhs;

  const HighsMipSolver& mip = lprelaxation.getMipSolver();
  const HighsInt slackOffset = lprelaxation.numCols();

  HighsInt numNz = inds.size();

  auto getLb = [&](HighsInt col) {
    return (col < slackOffset ? mip.mipdata_->domain.col_lower_[col]
                              : lprelaxation.slackLower(col - slackOffset));
  };

  auto getUb = [&](HighsInt col) {
    return (col < slackOffset ? mip.mipdata_->domain.col_upper_[col]
                              : lprelaxation.slackUpper(col - slackOffset));
  };

  auto remove = [&](HighsInt position) {
    numNz--;
    inds[position] = inds[numNz];
    vals[position] = vals[numNz];
    inds[numNz] = 0;
    vals[numNz] = 0;
  };

  HighsInt i = 0;
  while (i < numNz) {
    HighsInt col = inds[i];

    double lb = getLb(col);
    double ub = getUb(col);

    if (ub - lb < mip.options_mip_->small_matrix_value) {
      tmpRhs -= std::min(lb, ub) * vals[i];
      remove(i);
      continue;
    }

    if (lb == -kHighsInf && ub == kHighsInf) {
      vectorsum.clear();
      return false;
    }

    // the code below uses the difference between the column upper and lower
    // bounds as the upper bound for the slack from the variable upper bound
    // constraint (upper[j] = ub - lb) and thus assumes that the variable upper
    // bound constraints are tight. this assumption may not be satisfied when
    // new bound changes were derived during cut generation and, therefore, we
    // tighten the best variable upper bound.
    if (bestVub[col].first != -1 &&
        bestVub[col].second.maxValue() > ub + mip.mipdata_->feastol) {
      bool redundant = false;
      bool infeasible = false;
      mip.mipdata_->implications.cleanupVub(col, bestVub[col].first,
                                            bestVub[col].second, ub, redundant,
                                            infeasible, false);
    }

    // the code below uses the difference between the column upper and lower
    // bounds as the upper bound for the slack from the variable lower bound
    // constraint (upper[j] = ub - lb) and thus assumes that the variable lower
    // bound constraints are tight. this assumption may not be satisfied when
    // new bound changes were derived during cut generation and, therefore, we
    // tighten the best variable lower bound.
    if (bestVlb[col].first != -1 &&
        bestVlb[col].second.minValue() < lb - mip.mipdata_->feastol) {
      bool redundant = false;
      bool infeasible = false;
      mip.mipdata_->implications.cleanupVlb(col, bestVlb[col].first,
                                            bestVlb[col].second, lb, redundant,
                                            infeasible, false);
    }

    // store the old bound type so that we can restore it if the continuous
    // column is relaxed out anyways. This allows to correctly transform and
    // then untransform multiple base rows which is useful to compute cuts based
    // on several transformed base rows. It could otherwise lead to bugs if a
    // column is first transformed with a simple bound and not relaxed but for
    // another base row is transformed and relaxed with a variable bound. Should
    // the non-relaxed column now be untransformed we would wrongly use the
    // variable bound even though this is not the correct way to untransform the
    // column.
    BoundType oldBoundType = boundTypes[col];

    if (lprelaxation.isColIntegral(col)) {
      if (ub - lb <= 1.5 || boundDist[col] != 0.0 || simpleLbDist[col] == 0 ||
          simpleUbDist[col] == 0) {
        // since we skip the handling of variable bound constraints for all
        // binary and some general-integer variables here, the bound type used
        // should be a simple lower or upper bound
        if (simpleLbDist[col] < simpleUbDist[col] - mip.mipdata_->feastol) {
          boundTypes[col] = BoundType::kSimpleLb;
        } else if (simpleUbDist[col] <
                   simpleLbDist[col] - mip.mipdata_->feastol) {
          boundTypes[col] = BoundType::kSimpleUb;
        } else if (vals[i] > 0) {
          boundTypes[col] = BoundType::kSimpleLb;
        } else {
          boundTypes[col] = BoundType::kSimpleUb;
        }
        i++;
        continue;
      }
      if (bestVlb[col].first == -1 ||
          ubDist[col] < lbDist[col] - mip.mipdata_->feastol) {
        assert(bestVub[col].first != -1);
        boundTypes[col] = BoundType::kVariableUb;
      } else if (bestVub[col].first == -1 ||
                 lbDist[col] < ubDist[col] - mip.mipdata_->feastol) {
        assert(bestVlb[col].first != -1);
        boundTypes[col] = BoundType::kVariableLb;
      } else if (vals[i] > 0) {
        assert(bestVub[col].first != -1);
        boundTypes[col] = BoundType::kVariableUb;
      } else {
        assert(bestVlb[col].first != -1);
        boundTypes[col] = BoundType::kVariableLb;
      }
    } else {
      if (lbDist[col] < ubDist[col] - mip.mipdata_->feastol) {
        if (bestVlb[col].first == -1)
          boundTypes[col] = BoundType::kSimpleLb;
        else if (preferVbds || vals[i] > 0 ||
                 simpleLbDist[col] > lbDist[col] + mip.mipdata_->feastol)
          boundTypes[col] = BoundType::kVariableLb;
        else
          boundTypes[col] = BoundType::kSimpleLb;
      } else if (ubDist[col] < lbDist[col] - mip.mipdata_->feastol) {
        if (bestVub[col].first == -1)
          boundTypes[col] = BoundType::kSimpleUb;
        else if (preferVbds || vals[i] < 0 ||
                 simpleUbDist[col] > ubDist[col] + mip.mipdata_->feastol)
          boundTypes[col] = BoundType::kVariableUb;
        else
          boundTypes[col] = BoundType::kSimpleUb;
      } else if (vals[i] > 0) {
        if (bestVlb[col].first != -1)
          boundTypes[col] = BoundType::kVariableLb;
        else if (preferVbds && bestVub[col].first != -1)
          boundTypes[col] = BoundType::kVariableUb;
        else
          boundTypes[col] = BoundType::kSimpleLb;
      } else {
        if (bestVub[col].first != -1)
          boundTypes[col] = BoundType::kVariableUb;
        else if (preferVbds && bestVlb[col].first != -1)
          boundTypes[col] = BoundType::kVariableLb;
        else
          boundTypes[col] = BoundType::kSimpleUb;
      }
    }

    switch (boundTypes[col]) {
      case BoundType::kSimpleLb:
        if (vals[i] > 0) {
          // relax away using lower bound
          tmpRhs -= lb * vals[i];
          boundTypes[col] = oldBoundType;
          remove(i);
          continue;
        }
        break;
      case BoundType::kSimpleUb:
        if (vals[i] < 0) {
          // relax away using upper bound
          tmpRhs -= ub * vals[i];
          boundTypes[col] = oldBoundType;
          remove(i);
          continue;
        }
        break;
      case BoundType::kVariableLb:
        tmpRhs -= bestVlb[col].second.constant * vals[i];
        vectorsum.add(bestVlb[col].first, vals[i] * bestVlb[col].second.coef);
        if (vals[i] > 0) {
          boundTypes[col] = oldBoundType;
          remove(i);
          continue;
        }
        break;
      case BoundType::kVariableUb:
        tmpRhs -= bestVub[col].second.constant * vals[i];
        vectorsum.add(bestVub[col].first, vals[i] * bestVub[col].second.coef);
        vals[i] = -vals[i];
        if (vals[i] > 0) {
          boundTypes[col] = oldBoundType;
          remove(i);
          continue;
        }
    }
    // move to next element
    i++;
  }

  if (!vectorsum.getNonzeros().empty()) {
    for (HighsInt i = 0; i != numNz; ++i) {
      if (vals[i] != 0.0) vectorsum.add(inds[i], vals[i]);
    }

    double maxError = 0.0;
    auto IsZero = [&](HighsInt col, double val) {
      if (std::abs(val) <= mip.options_mip_->small_matrix_value) return true;
      return false;
    };

    vectorsum.cleanup(IsZero);
    if (maxError > mip.mipdata_->feastol) {
      vectorsum.clear();
      return false;
    }

    inds = vectorsum.getNonzeros();
    numNz = inds.size();

    vals.resize(numNz);
    for (HighsInt j = 0; j != numNz; ++j) vals[j] = vectorsum.getValue(inds[j]);

    vectorsum.clear();
  } else {
    vals.resize(numNz);
    inds.resize(numNz);
  }

  for (HighsInt j = 0; j != numNz; ++j) {
    HighsInt col = inds[j];

    // get bounds
    double lb = getLb(col);
    double ub = getUb(col);

    // variable should not be free
    assert(lb != -kHighsInf || ub != kHighsInf);

    // set bound type for previously unprocessed integer-constrained variables
    if (!lprelaxation.isColIntegral(col)) continue;

    // do not overwrite bound type for integral slacks from vlb / vub
    // constraints
    if (boundTypes[col] == BoundType::kVariableLb ||
        boundTypes[col] == BoundType::kVariableUb)
      continue;

    // complement integers to make coefficients positive if both bounds are
    // finite; otherwise, complement integers with closest bound.
    // take into account 'integersPositive' provided by caller.
    if (integersPositive) {
      if ((lb != -kHighsInf && vals[j] > 0) || ub == kHighsInf)
        boundTypes[col] = BoundType::kSimpleLb;
      else
        boundTypes[col] = BoundType::kSimpleUb;
    } else {
      if (lbDist[col] < ubDist[col])
        boundTypes[col] = BoundType::kSimpleLb;
      else
        boundTypes[col] = BoundType::kSimpleUb;
    }
  }

  upper.resize(numNz);
  solval.resize(numNz);

  for (HighsInt j = 0; j != numNz; ++j) {
    HighsInt col = inds[j];

    double lb = getLb(col);
    double ub = getUb(col);

    upper[j] = ub - lb;

    switch (boundTypes[col]) {
      case BoundType::kSimpleLb: {
        // shift (lower bound)
        assert(lb != -kHighsInf);
        tmpRhs -= lb * vals[j];
        solval[j] = lbDist[col];
        break;
      }
      case BoundType::kSimpleUb: {
        // complement (upper bound)
        assert(ub != kHighsInf);
        tmpRhs -= ub * vals[j];
        vals[j] = -vals[j];
        solval[j] = ubDist[col];
        break;
      }
      case BoundType::kVariableLb: {
        solval[j] = lbDist[col];
        break;
      }
      case BoundType::kVariableUb: {
        solval[j] = ubDist[col];
        break;
      }
    }

    // check if all integer-constrained variables have positive coefficients
    if (lprelaxation.isColIntegral(col))
      integersPositive = integersPositive && vals[j] > 0;
  }

  rhs = double(tmpRhs);

  if (numNz == 0 && rhs >= -mip.mipdata_->feastol) return false;

  return true;
}